

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall StrTest_Convert_Test::TestBody(StrTest_Convert_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  string s;
  AssertHelper local_50;
  undefined1 local_48 [12];
  undefined4 uStack_3c;
  AssertHelper local_38;
  string local_30;
  
  local_50.data_._0_4_ = 0x2a;
  str<int>(&local_30,(int *)&local_50);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_48,"\"42\"","str(42)",(char (*) [3])0x242e5f,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if ((undefined8 *)CONCAT44(uStack_3c,local_48._8_4_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(uStack_3c,local_48._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x72e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_30._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_48 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48._0_4_ = 0x7dc;
  local_48._4_4_ = 0xc;
  local_48._8_4_ = 9;
  str<Date>(&local_30,(Date *)local_48);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_48,"\"2012-12-9\"","s",(char (*) [10])"2012-12-9",&local_30);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(uStack_3c,local_48._8_4_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(uStack_3c,local_48._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x730,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_48 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(StrTest, Convert) {
  EXPECT_EQ("42", str(42));
  std::string s = str(Date(2012, 12, 9));
  EXPECT_EQ("2012-12-9", s);
}